

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 auStack_2cf98 [3832];
  undefined8 uStack_2c0a0;
  undefined1 auStack_2c098 [86016];
  undefined1 auStack_17098 [94295];
  allocator local_41;
  string local_40 [8];
  string arg;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  for (local_1c = 0; local_1c < argc; local_1c = local_1c + 1) {
    pcVar3 = argv[local_1c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar3,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((local_1c + 1 < argc) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"--count"), bVar1)) {
      local_1c = local_1c + 1;
      nodeCount = atoi(argv[local_1c]);
    }
    else if ((local_1c < argc) &&
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"--interleaved"), bVar1)) {
      interleaved = true;
    }
    else if ((local_1c < argc) &&
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"--textured"), bVar1)) {
      textured = true;
    }
    std::__cxx11::string::~string(local_40);
  }
  if ((interleaved & 1U) != 0) {
    textured = false;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Using ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,nodeCount);
  poVar2 = std::operator<<(poVar2," nodes...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  --interleaved ....: ");
  pcVar3 = "no";
  if ((interleaved & 1U) != 0) {
    pcVar3 = "yes";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  --textured .......: ");
  pcVar3 = "no";
  if ((textured & 1U) != 0) {
    pcVar3 = "yes";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  rengine::AllocationPool<rengine::RectangleNode>::setMemory
            (&rengine::RectangleNode::__allocation_pool_rengine_RectangleNode,auStack_17098,0x400);
  uStack_2c0a0 = 0x129dda;
  rengine::AllocationPool<rengine::TextureNode>::setMemory
            (&rengine::TextureNode::__allocation_pool_rengine_TextureNode,auStack_2c098,0x400);
  rengine::AllocationPool<rengine::Node>::setMemory
            (&rengine::Node::__allocation_pool_rengine_Node,auStack_2cf98,0x40);
  rengine::rengine_main<Rectangles>(argc,argv);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (i < argc && arg == "--interleaved") {
            interleaved = true;
        } else if (i < argc && arg == "--textured") {
            textured = true;
        }
    }

    if (interleaved)
        textured = false;

    std::cout << "Using " << nodeCount << " nodes..." << std::endl;
    std::cout << "  --interleaved ....: " << (interleaved ? "yes" : "no") << std::endl;
    std::cout << "  --textured .......: " << (textured ? "yes" : "no") << std::endl;

    RENGINE_ALLOCATION_POOL(RectangleNode, rengine_RectangleNode, 1024);
    RENGINE_ALLOCATION_POOL(TextureNode, rengine_TextureNode, 1024);
    RENGINE_ALLOCATION_POOL(Node, rengine_Node, 64);
    rengine_main<Rectangles>(argc, argv);
    return 0;
}